

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  const_reference ppcVar1;
  string *psVar2;
  char local_b1;
  undefined1 local_b0 [8];
  string sessionFilename;
  undefined1 local_88 [8];
  string filename;
  undefined1 local_58 [8];
  string projectName;
  string outputDir;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(*ppcVar1);
  std::__cxx11::string::string((string *)(projectName.field_2._M_local_buf + 8),(string *)psVar2);
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_58,*ppcVar1);
  sessionFilename.field_2._M_local_buf[0xf] = '/';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[5]>
            ((string *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&projectName.field_2 + 8),sessionFilename.field_2._M_local_buf + 0xf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [5])".cbp");
  local_b1 = '/';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[8]>
            ((string *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&projectName.field_2 + 8),&local_b1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [8])".layout");
  CreateNewProjectFile(this,lgs,(string *)local_88);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(projectName.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}